

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

float __thiscall
xatlas::internal::segment::Atlas::computeArea(Atlas *this,Chart *chart,uint32_t firstFace)

{
  float *pfVar1;
  uint *puVar2;
  uint32_t local_24;
  float local_20;
  uint32_t face;
  float area;
  uint32_t firstFace_local;
  Chart *chart_local;
  Atlas *this_local;
  
  local_20 = chart->area;
  local_24 = firstFace;
  do {
    pfVar1 = Array<float>::operator[](&this->m_faceAreas,local_24);
    local_20 = *pfVar1 + local_20;
    puVar2 = Array<unsigned_int>::operator[](&this->m_nextPlanarRegionFace,local_24);
    local_24 = *puVar2;
  } while (local_24 != firstFace);
  return local_20;
}

Assistant:

float computeArea(Chart *chart, uint32_t firstFace) const
	{
		float area = chart->area;
		uint32_t face = firstFace;
		for (;;) { 
			area += m_faceAreas[face];
			face = m_nextPlanarRegionFace[face];
			if (face == firstFace)
				break;
		}
		return area;
	}